

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall symbols::LenFunction::LenFunction(LenFunction *this)

{
  allocator<char> local_31;
  string local_30;
  LenFunction *local_10;
  LenFunction *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"len",&local_31);
  BuiltinFunction::BuiltinFunction(&this->super_BuiltinFunction,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._vptr_Object =
       (_func_int **)&PTR_type_001e01a0;
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}